

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

unique_ptr<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
 Catch::Generators::pf::
 make_unique<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,std::__cxx11::string>>,unary_op_tuple<trng::optimized_impl::uint128,std::__cxx11::string>>
           (unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *args)

{
  _Head_base<0UL,_Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
  in_RDI;
  _Head_base<0UL,_Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_false>
  this;
  
  this._M_head_impl = in_RDI._M_head_impl;
  operator_new(0x40);
  SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::SingleValueGenerator
            (this._M_head_impl,
             (unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI._M_head_impl);
  std::
  unique_ptr<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,std::__cxx11::string>>,std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,std::__cxx11::string>>>>
  ::
  unique_ptr<std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,std::__cxx11::string>>>,void>
            ((unique_ptr<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)this._M_head_impl,in_RDI._M_head_impl);
  return (__uniq_ptr_data<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_true>
          )(tuple<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_*,_std::default_delete<Catch::Generators::SingleValueGenerator<unary_op_tuple<trng::optimized_impl::uint128,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )this._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique( Args&&... args ) {
            return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
        }